

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

char * helics::actionMessageType(action_t action)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  value_type *res;
  char *local_20;
  action_t *in_stack_ffffffffffffffe8;
  unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
  *in_stack_fffffffffffffff0;
  const_iterator pvVar3;
  
  pvVar1 = frozen::
           unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
           ::find<helics::action_message_def::action_t>
                     (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  pvVar3 = pvVar1;
  pvVar2 = frozen::
           unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
           ::end((unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
                  *)0x530644);
  if (pvVar1 == pvVar2) {
    local_20 = "unknown";
  }
  else {
    local_20 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&pvVar3->second);
  }
  return local_20;
}

Assistant:

const char* actionMessageType(action_message_def::action_t action)
{
    const auto* res = actionStrings.find(action);
    return (res != actionStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}